

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int memdbClose(sqlite3_file *pFile)

{
  MemStore *pMVar1;
  long in_RDI;
  sqlite3_mutex *pVfsMutex;
  int i;
  MemStore *p;
  int in_stack_ffffffffffffffdc;
  int local_14;
  
  pMVar1 = *(MemStore **)(in_RDI + 8);
  if (pMVar1->zFName == (char *)0x0) {
    memdbEnter((MemStore *)0x157d39);
  }
  else {
    sqlite3MutexAlloc(in_stack_ffffffffffffffdc);
    sqlite3_mutex_enter((sqlite3_mutex *)0x157c7c);
    for (local_14 = 0; local_14 < memdb_g.nMemStore; local_14 = local_14 + 1) {
      if (memdb_g.apMemStore[local_14] == pMVar1) {
        memdbEnter((MemStore *)0x157cb5);
        if (pMVar1->nRef == 1) {
          memdb_g.nMemStore = memdb_g.nMemStore + -1;
          memdb_g.apMemStore[local_14] = memdb_g.apMemStore[memdb_g.nMemStore];
          if (memdb_g.nMemStore == 0) {
            sqlite3_free((void *)0x157d02);
            memdb_g.apMemStore = (MemStore **)0x0;
          }
        }
        break;
      }
    }
    sqlite3_mutex_leave((sqlite3_mutex *)0x157d2d);
  }
  pMVar1->nRef = pMVar1->nRef + -1;
  if (pMVar1->nRef < 1) {
    if ((pMVar1->mFlags & 1) != 0) {
      sqlite3_free((void *)0x157d70);
    }
    memdbLeave((MemStore *)0x157d7a);
    sqlite3_mutex_free((sqlite3_mutex *)0x157d88);
    sqlite3_free((void *)0x157d92);
  }
  else {
    memdbLeave((MemStore *)0x157d9e);
  }
  return 0;
}

Assistant:

static int memdbClose(sqlite3_file *pFile){
  MemStore *p = ((MemFile*)pFile)->pStore;
  if( p->zFName ){
    int i;
#ifndef SQLITE_MUTEX_OMIT
    sqlite3_mutex *pVfsMutex = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_VFS1);
#endif
    sqlite3_mutex_enter(pVfsMutex);
    for(i=0; ALWAYS(i<memdb_g.nMemStore); i++){
      if( memdb_g.apMemStore[i]==p ){
        memdbEnter(p);
        if( p->nRef==1 ){
          memdb_g.apMemStore[i] = memdb_g.apMemStore[--memdb_g.nMemStore];
          if( memdb_g.nMemStore==0 ){
            sqlite3_free(memdb_g.apMemStore);
            memdb_g.apMemStore = 0;
          }
        }
        break;
      }
    }
    sqlite3_mutex_leave(pVfsMutex);
  }else{
    memdbEnter(p);
  }
  p->nRef--;
  if( p->nRef<=0 ){
    if( p->mFlags & SQLITE_DESERIALIZE_FREEONCLOSE ){
      sqlite3_free(p->aData);
    }
    memdbLeave(p);
    sqlite3_mutex_free(p->pMutex);
    sqlite3_free(p);
  }else{
    memdbLeave(p);
  }
  return SQLITE_OK;
}